

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void BailOutRecord::ScheduleFunctionCodeGen
               (ScriptFunction *function,ScriptFunction *innerMostInlinee,
               BailOutRecord *bailOutRecord,BailOutKind bailOutKind,uint32 actualBailOutOffset,
               ImplicitCallFlags savedImplicitCallFlags,void *returnAddress)

{
  undefined1 *puVar1;
  uint *puVar2;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar3;
  FunctionEntryPointInfo *pFVar4;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  ExecutionMode EVar8;
  ImplicitCallFlags IVar9;
  BYTE BVar10;
  byte bVar11;
  ushort uVar12;
  uint uVar13;
  LocalFunctionId LVar14;
  int iVar15;
  uint32 uVar16;
  FunctionBody *pFVar17;
  ScriptContext *pSVar18;
  FunctionEntryPointInfo *pFVar19;
  ulong uVar20;
  undefined4 *puVar21;
  ScriptContext *pSVar22;
  undefined4 extraout_var;
  char *pcVar23;
  char *pcVar24;
  JavascriptMethod entryPoint;
  undefined4 extraout_var_00;
  char16 *pcVar25;
  uint uVar26;
  ulong uVar27;
  char16_t *pcVar28;
  BailOutKind bailOutKind_00;
  RejitReason reason;
  RejitReason RVar29;
  uint local_d8 [2];
  char16 debugStringBuffer [42];
  uint local_68;
  uint local_64;
  ScriptFunction *local_60;
  BailOutRecord *local_58;
  ulong local_50;
  Type local_48;
  byte local_41;
  DynamicProfileInfo *local_40;
  FunctionBody *local_38;
  
  if (bailOutKind == BailOnSimpleJitToFullJitLoopBody) {
    return;
  }
  if (bailOutKind == BailOutForGeneratorYield) {
    return;
  }
  local_60 = function;
  local_48 = actualBailOutOffset;
  pFVar17 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar17);
  LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar17);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,ReJITPhase,uVar13,LVar14);
  if (bVar6) {
    return;
  }
  local_50 = (ulong)bailOutKind;
  pSVar18 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar17);
  pSVar18->firstInterpreterFrameReturnAddress = returnAddress;
  bailOutRecord->bailOutCount = bailOutRecord->bailOutCount + 1;
  pFVar19 = GetFunctionEntryPointInfo(bailOutRecord);
  pSVar3 = (pFVar17->entryPoints).ptr;
  local_58 = bailOutRecord;
  local_38 = pFVar17;
  if (pSVar3 == (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                 *)0x0) {
LAB_003e5da9:
    bVar6 = ThreadContext::IsOldEntryPointInfo
                      (((((((local_60->super_ScriptFunctionBase).super_JavascriptFunction.
                            super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary)
                         .ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext,
                       (ProxyEntryPointInfo *)pFVar19);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar21 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x752,"(foundEntryPoint)","foundEntryPoint");
      if (!bVar6) goto LAB_003e6925;
      *puVar21 = 0;
    }
  }
  else {
    uVar26 = (pSVar3->
             super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ).
             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
             .count;
    uVar27 = 0;
    uVar20 = (ulong)uVar26;
    if ((int)uVar26 < 1) {
      uVar20 = uVar27;
    }
    do {
      if (uVar20 == uVar27) goto LAB_003e5da9;
      pFVar4 = (FunctionEntryPointInfo *)
               (((pSVar3->
                 super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ).
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                 .buffer.ptr[uVar27].ptr)->super_RecyclerWeakReferenceBase).strongRef;
      uVar27 = uVar27 + 1;
    } while (pFVar4 == (FunctionEntryPointInfo *)0x0 || pFVar19 != pFVar4);
  }
  uVar26 = 0xff;
  if (pFVar19->callsCount < 0xff) {
    uVar26 = pFVar19->callsCount;
  }
  local_41 = (byte)uVar26 - ((char)DAT_0144d96c + 1U);
  if ((byte)uVar26 < (byte)((char)DAT_0144d96c + 1U)) {
    local_41 = 0;
  }
  bailOutKind_00 = (BailOutKind)local_50;
  CheckPreemptiveRejit(local_38,bailOutKind_00,local_58,&local_41,-1);
  local_64 = (uint)local_41;
  pFVar19->callsCount = local_64;
  if (bailOutKind_00 == BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar21 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar21 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x75f,"(bailOutKind != IR::BailOutInvalid)",
                       "bailOutKind != IR::BailOutInvalid");
    if (!bVar6) {
LAB_003e6925:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar21 = 0;
  }
  if ((local_38->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
    local_40 = (DynamicProfileInfo *)0x0;
LAB_003e5f03:
    uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
    LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)local_38);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,ReJITPhase,uVar13,LVar14);
    if (bVar6) goto LAB_003e5f3b;
    goto switchD_003e63f7_caseD_c;
  }
  local_40 = Js::FunctionBody::GetAnyDynamicProfileInfo(local_38);
  if (local_40 == (DynamicProfileInfo *)0x0 || (char)local_64 != '\0') goto LAB_003e5f03;
LAB_003e5f3b:
  pFVar17 = local_38;
  if (((local_50 & 0x30003c00) == 0) &&
     ((0x1f < (uint)local_50 || ((0xc0000002U >> ((uint)local_50 & 0x1f) & 1) == 0)))) {
    if ((local_50 & 0xfe00000) == 0) {
      switch((uint)local_50) {
      case 2:
      case 3:
        if ((*(uint *)&local_40->bits >> 9 & 1) != 0) goto LAB_003e685e;
        *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x200;
        RVar29 = FloatTypeSpecDisabled;
        break;
      case 4:
      case 5:
        IVar9 = Js::FunctionBody::GetSavedImplicitCallsFlags(local_38);
        if ((IVar9 & savedImplicitCallFlags) != ImplicitCall_None) goto LAB_003e685e;
        Js::DynamicProfileInfo::RecordImplicitCallFlags(local_40,savedImplicitCallFlags);
        puVar1 = &(local_40->bits).field_0x4;
        *puVar1 = *puVar1 | 4;
        RVar29 = ImplicitCallFlagsChanged;
        break;
      case 6:
        if ((*(uint *)&local_40->bits & 0x40) != 0) goto LAB_003e685e;
        *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x40;
        RVar29 = LossyIntTypeSpecDisabled;
        break;
      case 7:
        if ((char)*(uint *)&local_40->bits < '\0') goto LAB_003e685e;
        *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x80;
        RVar29 = MemOpDisabled;
        break;
      case 8:
      case 10:
      case 0x18:
        if (innerMostInlinee == (ScriptFunction *)0x0) {
          BVar10 = Js::FunctionBody::GetSavedInlinerVersion(local_38);
          RVar29 = InlineeChanged;
          if (BVar10 == local_40->currentInlinerVersion) goto LAB_003e685e;
        }
        else {
          RVar29 = InlineeChanged;
        }
        break;
      case 9:
        if (((local_40->bits).field_0x3 & 0x20) != 0) goto LAB_003e685e;
        bVar11 = local_38->bailOnMisingProfileRejitCount + 1;
        local_38->bailOnMisingProfileRejitCount = bVar11;
        if (bVar11 <= DAT_0143031c) {
          local_38->bailOnMisingProfileCount = '\0';
          RVar29 = NoProfile;
          goto LAB_003e5fcb;
        }
        puVar1 = &(local_40->bits).field_0x3;
        *puVar1 = *puVar1 | 0x20;
        RVar29 = NoProfile;
        break;
      case 0xb:
        RVar29 = FailedPolymorphicInlineeTypeCheck;
        break;
      case 0xc:
      case 0x15:
      case 0x1e:
      case 0x1f:
      case 0x20:
      case 0x24:
      case 0x25:
        goto switchD_003e63f7_caseD_c;
      case 0xd:
        if ((*(uint *)&local_40->bits >> 0xb & 1) != 0) goto LAB_003e685e;
        *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x1800;
        RVar29 = ArrayCheckHoistDisabled;
        break;
      case 0xe:
        RVar29 = ExpectingNativeArray;
        if (0x31 < local_40->rejitCount) goto LAB_003e685e;
        break;
      case 0xf:
        if ((*(uint *)&local_40->bits >> 0x13 & 1) != 0) goto LAB_003e685e;
        *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x180000;
        RVar29 = TypedArrayTypeSpecDisabled;
        break;
      case 0x10:
        if ((*(uint *)&local_40->bits >> 0x15 & 1) != 0) goto LAB_003e685e;
        *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x200000;
        RVar29 = LdLenIntSpecDisabled;
        break;
      case 0x11:
        if ((*(uint *)&local_40->bits >> 10 & 1) != 0) goto LAB_003e685e;
        *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x400;
        RVar29 = CheckThisDisabled;
        break;
      case 0x12:
        bVar11 = (local_40->bits).field_0x4;
        if ((bVar11 & 0x10) != 0) goto LAB_003e685e;
        (local_40->bits).field_0x4 = bVar11 | 0x10;
        RVar29 = FailedTagCheck;
        break;
      case 0x13:
      case 0x19:
        if (innerMostInlinee == (ScriptFunction *)0x0) {
          uVar26 = local_40->polymorphicCacheState;
          uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
          LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar17);
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar13,LVar14);
          if (bVar6) {
            pcVar25 = Js::FunctionProxy::GetDebugNumberSet
                                ((FunctionProxy *)pFVar17,(wchar (*) [42])local_d8);
            uVar16 = Js::FunctionBody::GetSavedPolymorphicCacheState(local_38);
            Output::Print(L"Objtypespec (%s): States on bailout: Saved cache: %d, Live cache: %d\n",
                          pcVar25,(ulong)uVar16,(ulong)uVar26);
            Output::Flush();
            pFVar17 = local_38;
          }
          uVar16 = Js::FunctionBody::GetSavedPolymorphicCacheState(pFVar17);
          if (uVar26 <= uVar16) {
            RVar29 = None;
            bVar6 = true;
            goto LAB_003e5fe6;
          }
        }
        RVar29 = (uint)local_50 == 0x13 ^ FailedFixedFieldTypeCheck;
        break;
      case 0x14:
      case 0x1b:
        if (*(int *)&local_40->bits < 0) goto LAB_003e685e;
        RVar29 = FailedEquivalentFixedFieldTypeCheck - ((uint)local_50 == 0x14);
        break;
      case 0x16:
        if ((*(uint *)&local_40->bits >> 0x1e & 1) != 0) goto LAB_003e685e;
        *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x40000000;
        RVar29 = DisableSwitchOptExpectingInteger;
        break;
      case 0x17:
        if ((*(uint *)&local_40->bits >> 0x1e & 1) != 0) goto LAB_003e685e;
        *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x40000000;
        RVar29 = DisableSwitchOptExpectingString;
        break;
      case 0x1a:
        RVar29 = FailedFixedFieldCheck;
        break;
      case 0x1c:
        if ((*(uint *)&local_40->bits >> 0x1c & 1) != 0) goto LAB_003e685e;
        *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x10000000;
        RVar29 = FloorInliningDisabled;
        break;
      case 0x1d:
        RVar29 = ModByPowerOf2;
        break;
      case 0x21:
        RVar29 = CtorGuardInvalidated;
        break;
      case 0x22:
        if ((*(uint *)&local_40->bits >> 0x16 & 1) != 0) goto LAB_003e685e;
        *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0xc00000;
        RVar29 = BoundCheckHoistDisabled;
        break;
      case 0x23:
        if ((*(uint *)&local_40->bits >> 0x18 & 1) != 0) goto LAB_003e685e;
        *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x3000000;
        RVar29 = LoopCountBasedBoundCheckHoistDisabled;
        break;
      case 0x26:
        bVar11 = (local_40->bits).field_0x4;
        if ((bVar11 & 0x20) != 0) goto LAB_003e685e;
        (local_40->bits).field_0x4 = bVar11 | 0x20;
        RVar29 = OptimizeTryFinallyDisabled;
        break;
      default:
        if ((uint)local_50 == 0x2000) {
          bVar11 = (local_40->bits).field_0x4;
          if ((bVar11 & 2) != 0) goto LAB_003e685e;
          (local_40->bits).field_0x4 = bVar11 | 2;
          RVar29 = PowIntIntTypeSpecDisabled;
          break;
        }
        if ((uint)local_50 == 0x4000) {
          if ((*(uint *)&local_40->bits >> 0xd & 1) != 0) goto LAB_003e685e;
          *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x6000;
          RVar29 = ArrayMissingValueCheckHoistDisabled;
          break;
        }
        if ((uint)local_50 == 0x8000) {
          RVar29 = ExpectingConventionalNativeArrayAccess;
          break;
        }
        if ((uint)local_50 == 0x10000) {
          RVar29 = ConvertedNativeArray;
          break;
        }
        if ((uint)local_50 == 0x20000) {
          RVar29 = ArrayAccessNeededHelperCall;
          break;
        }
        if ((uint)local_50 == 0x40000) {
          if (-1 < (short)*(uint *)&local_40->bits) {
            *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0x18000;
            RVar29 = JsArraySegmentHoistDisabled;
            break;
          }
LAB_003e685e:
          bVar6 = true;
        }
        else {
          bVar6 = false;
          if ((uint)local_50 == 0x100000) {
            bVar11 = (local_40->bits).field_0x4;
            if ((bVar11 & 8) == 0) {
              (local_40->bits).field_0x4 = bVar11 | 8;
              RVar29 = DisableStackArgOpt;
              break;
            }
            goto LAB_003e685e;
          }
        }
        goto LAB_003e5fdf;
      }
      bVar6 = false;
    }
    else {
switchD_003e63f7_caseD_c:
      bVar6 = false;
LAB_003e5fdf:
      RVar29 = None;
    }
  }
  else if (((uint)local_50 >> 0xb & 1) == 0) {
    uVar26 = *(uint *)&local_40->bits;
    if ((uint)local_50 == 0x1f || (local_50 & 0x30000000) != 0) {
      if ((uVar26 & 0x10) != 0) goto LAB_003e5fb7;
      *(uint *)&local_40->bits = uVar26 | 0x30;
      RVar29 = DivIntTypeSpecDisabled;
      goto LAB_003e5fcb;
    }
    if ((uVar26 & 1) == 0) {
      *(uint *)&local_40->bits = uVar26 | 3;
      RVar29 = AggressiveIntTypeSpecDisabled;
      goto LAB_003e5fcb;
    }
LAB_003e5fb7:
    bVar6 = true;
    RVar29 = None;
  }
  else {
    if ((*(uint *)&local_40->bits & 4) != 0) goto LAB_003e5fb7;
    *(uint *)&local_40->bits = *(uint *)&local_40->bits | 0xc;
    RVar29 = AggressiveMulIntTypeSpecDisabled;
LAB_003e5fcb:
    bVar6 = false;
  }
LAB_003e5fe6:
  uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
  LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)local_38);
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,ReJITPhase,uVar13,LVar14);
  reason = Forced;
  if (!bVar7) {
    reason = RVar29;
  }
  if (RVar29 != None) {
    reason = RVar29;
  }
  if (reason == None || bVar6) goto LAB_003e609b;
  uVar12 = local_40->rejitCount;
  if (uVar12 < 100) {
    if (local_40->bailOutOffsetForLastRejit == local_48) {
      bVar7 = Js::ScriptFunction::IsNewEntryPointAvailable(local_60);
      if (bVar7) goto LAB_003e6042;
      uVar12 = local_40->rejitCount;
    }
    local_40->rejitCount = uVar12 + 1;
    local_40->bailOutOffsetForLastRejit = local_48;
  }
  else {
LAB_003e6042:
    pSVar22 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_38);
    bVar6 = true;
    if (pSVar22->rejitReasonCountsCap != (uint *)0x0) {
      puVar2 = pSVar22->rejitReasonCountsCap + reason;
      *puVar2 = *puVar2 + 1;
    }
    reason = None;
  }
LAB_003e609b:
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,ReJITPhase);
  local_48 = (Type)reason;
  if ((bVar7) &&
     ((DAT_0145c3e0 == DAT_0145c3e8 ||
      (bVar7 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c3c0,(uint32)local_50), bVar7)))) {
    pFVar17 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_60);
    iVar15 = (*(pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar17);
    pcVar23 = GetBailOutKindName((BailOutKind)local_50);
    uVar12 = local_58->bailOutCount;
    pcVar24 = GetRejitReasonName((RejitReason)local_48);
    pcVar28 = L"false";
    if (bVar6) {
      pcVar28 = L"true";
    }
    Output::Print(L"Bailout from function: function: %s, bailOutKindName: (%S), bailOutCount: %d, callCount: %d, reJitReason: %S, reThunk: %s\r\n"
                  ,CONCAT44(extraout_var,iVar15),pcVar23,(ulong)uVar12,(ulong)local_64,pcVar24,
                  pcVar28);
    Output::Flush();
  }
  pSVar22 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_38);
  Js::ScriptContext::LogBailout(pSVar22,local_38,(uint)local_50);
  pFVar17 = local_38;
  if (500 < local_58->bailOutCount) {
    pSVar22 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_38);
    this = pSVar22->bailoutReasonCountsCap;
    if (this != (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)0x0) {
      local_d8[0] = (uint)local_50;
      bVar7 = JsUtil::
              BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(this,local_d8);
      uVar26 = (uint)local_50;
      if (bVar7) {
        local_68 = uVar26;
        local_d8[0] = JsUtil::
                      BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::Item(this,&local_68);
        local_d8[0] = local_d8[0] + 1;
        local_68 = uVar26;
        JsUtil::
        BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                  ((BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this,&local_68,local_d8);
      }
      else {
        local_68 = 1;
        local_d8[0] = uVar26;
        JsUtil::
        BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                  ((BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this,local_d8,&local_68);
      }
    }
  }
  if (bVar6) {
    bVar7 = (pFVar17->field_0x179 & 8) != 0;
    if (bVar7) {
      bVar6 = false;
    }
    reason = AfterLoopBodyRejit;
    if (!bVar7) {
      reason = (RejitReason)local_48;
    }
  }
  if (bVar6) {
    pFVar19 = Js::FunctionBody::GetDefaultFunctionEntryPointInfo(pFVar17);
    entryPoint = Js::FunctionProxy::GetDirectEntryPoint
                           ((FunctionProxy *)pFVar17,(ProxyEntryPointInfo *)pFVar19);
    Js::ScriptFunction::UpdateThunkEntryPoint(local_60,pFVar19,entryPoint);
  }
  else if (reason != None) {
    if ((local_58->type == SharedForLoopTop) &&
       (bVar6 = IR::IsTypeCheckBailOutKind(local_58->bailOutKind), pFVar17 = local_38, bVar6)) {
      puVar1 = &(local_40->bits).field_0x4;
      *puVar1 = *puVar1 | 0x40;
    }
    pSVar22 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar17);
    Js::ScriptContext::LogRejit(pSVar22,local_38,reason);
    local_38->field_0x179 = local_38->field_0x179 & 0xf7;
    pSVar22 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)local_38);
    GenerateFunction(pSVar22->nativeCodeGen,local_38,local_60);
    EVar8 = Js::FunctionBody::GetExecutionMode(local_38);
    if (EVar8 != FullJit) {
      Js::FunctionBody::TraceExecutionMode(local_38,"Rejit (before)");
      Js::FunctionBody::TransitionToFullJitExecutionMode(local_38);
      Js::FunctionBody::TraceExecutionMode(local_38,"Rejit");
    }
    uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
    LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)local_38);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ReJITPhase,uVar13,LVar14);
    pFVar17 = local_38;
    if (bVar6) {
      iVar15 = (*(local_38->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                 .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(local_38);
      uVar20 = local_50;
      pcVar25 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)pFVar17,(wchar (*) [42])local_d8);
      Output::Print(L"Rejit: function: %s (%s), bailOutCount: %hu",CONCAT44(extraout_var_00,iVar15),
                    pcVar25,(ulong)local_58->bailOutCount);
      Output::Print(L" callCount: %u",(ulong)local_41);
      pcVar23 = GetRejitReasonName(reason);
      Output::Print(L" reason: %S",pcVar23);
      if ((BailOutKind)uVar20 != BailOutInvalid) {
        pcVar23 = GetBailOutKindName((BailOutKind)uVar20);
        Output::Print(L" (%S)",pcVar23);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
  }
  pSVar18->firstInterpreterFrameReturnAddress = (void *)0x0;
  return;
}

Assistant:

void BailOutRecord::ScheduleFunctionCodeGen(Js::ScriptFunction * function, Js::ScriptFunction * innerMostInlinee,
    BailOutRecord const * bailOutRecord, IR::BailOutKind bailOutKind, uint32 actualBailOutOffset, Js::ImplicitCallFlags savedImplicitCallFlags, void * returnAddress)
{
    if (bailOutKind == IR::BailOnSimpleJitToFullJitLoopBody ||
        bailOutKind == IR::BailOutForGeneratorYield ||
        bailOutKind == IR::LazyBailOut)
    {
        return;
    }

    Js::FunctionBody * executeFunction = function->GetFunctionBody();

    if (PHASE_OFF(Js::ReJITPhase, executeFunction))
    {
        return;
    }

    Js::AutoPushReturnAddressForStackWalker saveReturnAddress(executeFunction->GetScriptContext(), returnAddress);

    BailOutRecord * bailOutRecordNotConst = (BailOutRecord *)(void *)bailOutRecord;
    bailOutRecordNotConst->bailOutCount++;

    Js::FunctionEntryPointInfo *entryPointInfo = bailOutRecord->GetFunctionEntryPointInfo();

#if DBG
    // BailOutRecord is not recycler-allocated, so make sure something the recycler can see was keeping the entry point info alive.
    // We expect the entry point to be kept alive as follows:
    // 1. The function's current type might still have the same entry point info as when we entered the function (easy case)
    // 2. The function might have moved to a successor path type, which still keeps the previous type and its entry point info alive
    // 3. The entry point info might be held by the ThreadContext (QueueFreeOldEntryPointInfoIfInScript):
    //   a. If the entry point info was replaced on the type that used to hold it (ScriptFunction::ChangeEntryPoint)
    //   b. If the function's last-added property was deleted and it moved to a previous type (ScriptFunction::ReplaceTypeWithPredecessorType)
    //   c. If the function's path type got replaced with a dictionary, then all previous entry point infos in that path are queued on the ThreadContext (ScriptFunction::PrepareForConversionToNonPathType)
    bool foundEntryPoint = false;
    executeFunction->MapEntryPointsUntil([&](int index, Js::FunctionEntryPointInfo* info)
    {
        foundEntryPoint = info == entryPointInfo;
        return foundEntryPoint;
    });
    foundEntryPoint = foundEntryPoint || function->GetScriptContext()->GetThreadContext()->IsOldEntryPointInfo(entryPointInfo);
    Assert(foundEntryPoint);
#endif

    uint8 callsCount = entryPointInfo->callsCount > 255 ? 255 : static_cast<uint8>(entryPointInfo->callsCount);
    RejitReason rejitReason = RejitReason::None;
    bool reThunk = false;

    callsCount = callsCount <= Js::FunctionEntryPointInfo::GetDecrCallCountPerBailout() ? 0 : callsCount - Js::FunctionEntryPointInfo::GetDecrCallCountPerBailout() ;

    CheckPreemptiveRejit(executeFunction, bailOutKind, bailOutRecordNotConst, callsCount, -1);

    entryPointInfo->callsCount = callsCount;

    Assert(bailOutKind != IR::BailOutInvalid);

    Js::DynamicProfileInfo * profileInfo = executeFunction->HasDynamicProfileInfo() ? executeFunction->GetAnyDynamicProfileInfo() : nullptr;
    if ((profileInfo && callsCount == 0) ||
        PHASE_FORCE(Js::ReJITPhase, executeFunction))
    {
        if ((bailOutKind & (IR::BailOutOnResultConditions | IR::BailOutOnDivSrcConditions)) || bailOutKind == IR::BailOutIntOnly || bailOutKind == IR::BailOnIntMin || bailOutKind == IR::BailOnDivResultNotInt)
        {
            // Note WRT BailOnIntMin: it wouldn't make sense to re-jit without changing anything here, as interpreter will not change the (int) type,
            // so the options are: (1) rejit with disabling int type spec, (2) don't rejit, always bailout.
            // It seems to be better to rejit.
            if (bailOutKind & IR::BailOutOnMulOverflow)
            {
                if (profileInfo->IsAggressiveMulIntTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableAggressiveMulIntTypeSpec(false);
                    rejitReason = RejitReason::AggressiveMulIntTypeSpecDisabled;
                }
            }
            else if ((bailOutKind & (IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt)) || bailOutKind == IR::BailOnDivResultNotInt)
            {
                if (profileInfo->IsDivIntTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableDivIntTypeSpec(false);
                    rejitReason = RejitReason::DivIntTypeSpecDisabled;
                }
            }
            else
            {
                if (profileInfo->IsAggressiveIntTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableAggressiveIntTypeSpec(false);
                    rejitReason = RejitReason::AggressiveIntTypeSpecDisabled;
                }
            }
        }
        else if (bailOutKind & IR::BailOutForDebuggerBits)
        {
            // Do not rejit, do not rethunk, just ignore the bailout.
        }
        else switch(bailOutKind)
        {
            case IR::BailOutOnNotPrimitive:
                if (profileInfo->IsLossyIntTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableLossyIntTypeSpec();
                    rejitReason = RejitReason::LossyIntTypeSpecDisabled;
                }
                break;
            case IR::BailOutOnMemOpError:
                if (profileInfo->IsMemOpDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableMemOp();
                    rejitReason = RejitReason::MemOpDisabled;
                }
                break;

            case IR::BailOutPrimitiveButString:
            case IR::BailOutNumberOnly:
                if (profileInfo->IsFloatTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableFloatTypeSpec();
                    rejitReason = RejitReason::FloatTypeSpecDisabled;
                }
                break;

            case IR::BailOutOnImplicitCalls:
            case IR::BailOutOnImplicitCallsPreOp:
                // Check if the implicit call flags in the profile have changed since we last JITed this
                // function body. If so, and they indicate an implicit call of some sort occurred
                // then we need to reJIT.
                if ((executeFunction->GetSavedImplicitCallsFlags() & savedImplicitCallFlags) == Js::ImplicitCall_None)
                {
                    profileInfo->RecordImplicitCallFlags(savedImplicitCallFlags);
                    profileInfo->DisableLoopImplicitCallInfo();
                    rejitReason = RejitReason::ImplicitCallFlagsChanged;
                }
                else
                {
                    reThunk = true;
                }
                break;

            case IR::BailOnModByPowerOf2:
                rejitReason = RejitReason::ModByPowerOf2;
                break;

            case IR::BailOutOnNotArray:
                if(profileInfo->IsArrayCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableArrayCheckHoist(false);
                    rejitReason = RejitReason::ArrayCheckHoistDisabled;
                }
                break;

            case IR::BailOutOnNotNativeArray:

                // REVIEW: We have an issue with array profile info.  The info on the type of array we have won't
                //         get fixed by rejitting.  For now, just give up after 50 rejits.
                if (profileInfo->GetRejitCount() >= 50)
                {
                    reThunk = true;
                }
                else
                {
                    rejitReason = RejitReason::ExpectingNativeArray;
                }
                break;

            case IR::BailOutConvertedNativeArray:
                rejitReason = RejitReason::ConvertedNativeArray;
                break;

            case IR::BailOutConventionalTypedArrayAccessOnly:
                if(profileInfo->IsTypedArrayTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableTypedArrayTypeSpec(false);
                    rejitReason = RejitReason::TypedArrayTypeSpecDisabled;
                }
                break;

            case IR::BailOutConventionalNativeArrayAccessOnly:
                rejitReason = RejitReason::ExpectingConventionalNativeArrayAccess;
                break;

            case IR::BailOutOnMissingValue:
                if(profileInfo->IsArrayMissingValueCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableArrayMissingValueCheckHoist(false);
                    rejitReason = RejitReason::ArrayMissingValueCheckHoistDisabled;
                }
                break;

            case IR::BailOutOnArrayAccessHelperCall:
                // This is a pre-op bailout, so the interpreter will update the profile data for this byte-code instruction to
                // prevent excessive bailouts here in the future
                rejitReason = RejitReason::ArrayAccessNeededHelperCall;
                break;

            case IR::BailOutOnInvalidatedArrayHeadSegment:
                if(profileInfo->IsJsArraySegmentHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableJsArraySegmentHoist(false);
                    rejitReason = RejitReason::JsArraySegmentHoistDisabled;
                }
                break;

            case IR::BailOutOnIrregularLength:
                if(profileInfo->IsLdLenIntSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableLdLenIntSpec();
                    rejitReason = RejitReason::LdLenIntSpecDisabled;
                }
                break;

            case IR::BailOutOnFailedHoistedBoundCheck:
                if(profileInfo->IsBoundCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableBoundCheckHoist(false);
                    rejitReason = RejitReason::BoundCheckHoistDisabled;
                }
                break;

            case IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck:
                if(profileInfo->IsLoopCountBasedBoundCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableLoopCountBasedBoundCheckHoist(false);
                    rejitReason = RejitReason::LoopCountBasedBoundCheckHoistDisabled;
                }
                break;

            case IR::BailOutExpectingInteger:
                if (profileInfo->IsSwitchOptDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableSwitchOpt();
                    rejitReason = RejitReason::DisableSwitchOptExpectingInteger;
                }
                break;

            case IR::BailOutExpectingString:
                if (profileInfo->IsSwitchOptDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableSwitchOpt();
                    rejitReason = RejitReason::DisableSwitchOptExpectingString;
                }
                break;

            case IR::BailOutOnFailedPolymorphicInlineTypeCheck:
                rejitReason = RejitReason::FailedPolymorphicInlineeTypeCheck;
                break;

            case IR::BailOnStackArgsOutOfActualsRange:
                if (profileInfo->IsStackArgOptDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableStackArgOpt();
                    rejitReason = RejitReason::DisableStackArgOpt;
                }
                break;
            case IR::BailOutOnPolymorphicInlineFunction:
            case IR::BailOutFailedInlineTypeCheck:
            case IR::BailOutOnInlineFunction:
                // Check if the inliner state has changed since we last JITed this function body. If so
                // then we need to reJIT.
                if (innerMostInlinee)
                {
                    // There is no way now to check if the inlinee version has changed. Just rejit.
                    // This should be changed to getting the inliner version corresponding to inlinee.
                    rejitReason = RejitReason::InlineeChanged;
                }
                else
                {
                    if (executeFunction->GetSavedInlinerVersion() == profileInfo->GetInlinerVersion())
                    {
                        reThunk = true;
                    }
                    else
                    {
                        rejitReason = RejitReason::InlineeChanged;
                    }
                }
                break;

            case IR::BailOutOnNoProfile:
                if (profileInfo->IsNoProfileBailoutsDisabled())
                {
                    reThunk = true;
                }
                else if (executeFunction->IncrementBailOnMisingProfileRejitCount() >  (uint)CONFIG_FLAG(BailOnNoProfileRejitLimit))
                {
                    profileInfo->DisableNoProfileBailouts();
                    rejitReason = RejitReason::NoProfile;
                }
                else
                {
                    executeFunction->ResetBailOnMisingProfileCount();
                    rejitReason = RejitReason::NoProfile;
                }
                break;

            case IR::BailOutCheckThis:
                // Presumably we've started passing a different "this" pointer to callees.
                if (profileInfo->IsCheckThisDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableCheckThis();
                    rejitReason = RejitReason::CheckThisDisabled;
                }
                break;

            case IR::BailOutOnTaggedValue:
                if (profileInfo->IsTagCheckDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableTagCheck();
                    rejitReason = RejitReason::FailedTagCheck;
                }
                break;

            case IR::BailOutFailedTypeCheck:
            case IR::BailOutFailedFixedFieldTypeCheck:
            {
                // An inline cache must have gone from monomorphic to polymorphic.
                // This is already noted in the profile data, so optimization of the given ld/st will
                // be inhibited on re-jit.
                // Consider disabling the optimization across the function after n failed type checks.
                if (innerMostInlinee)
                {
                    rejitReason = bailOutKind == IR::BailOutFailedTypeCheck ? RejitReason::FailedTypeCheck : RejitReason::FailedFixedFieldTypeCheck;
                }
                else
                {
                    uint32 state;
                    state = profileInfo->GetPolymorphicCacheState();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                    if (PHASE_TRACE(Js::ObjTypeSpecPhase, executeFunction))
                    {
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                        Output::Print(
                            _u("Objtypespec (%s): States on bailout: Saved cache: %d, Live cache: %d\n"),
                            executeFunction->GetDebugNumberSet(debugStringBuffer), executeFunction->GetSavedPolymorphicCacheState(), state);
                        Output::Flush();
                    }
#endif
                    if (state <= executeFunction->GetSavedPolymorphicCacheState())
                    {
                        reThunk = true;
                    }
                    else
                    {
                        rejitReason = bailOutKind == IR::BailOutFailedTypeCheck ?
                            RejitReason::FailedTypeCheck : RejitReason::FailedFixedFieldTypeCheck;
                    }
                }
                break;
            }

            case IR::BailOutFailedEquivalentTypeCheck:
            case IR::BailOutFailedEquivalentFixedFieldTypeCheck:
                if (profileInfo->IsEquivalentObjTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    rejitReason = bailOutKind == IR::BailOutFailedEquivalentTypeCheck ?
                        RejitReason::FailedEquivalentTypeCheck : RejitReason::FailedEquivalentFixedFieldTypeCheck;
                }
                break;

            case IR::BailOutFailedFixedFieldCheck:
                rejitReason = RejitReason::FailedFixedFieldCheck;
                break;

            case IR::BailOutFailedCtorGuardCheck:
                // (ObjTypeSpec): Consider scheduling re-JIT right after the first bailout.  We will never successfully execute the
                // function from which we just bailed out, unless we take a different code path through it.

                // A constructor cache guard may be invalidated for one of two reasons:
                // a) the constructor's prototype property has changed, or
                // b) one of the properties protected by the guard (this constructor cache served as) has changed in some way (e.g. became read-only).
                // In the former case, the cache itself will be marked as polymorphic and on re-JIT we won't do the optimization.
                // In the latter case, the inline cache for the offending property will be cleared and on re-JIT the guard will not be enlisted
                // to protect that property operation.
                rejitReason = RejitReason::CtorGuardInvalidated;
                break;

            case IR::BailOutOnFloor:
            {
                if (profileInfo->IsFloorInliningDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableFloorInlining();
                    rejitReason = RejitReason::FloorInliningDisabled;
                }
                break;
            }
            case IR::BailOutOnPowIntIntOverflow:
            {
                if (profileInfo->IsPowIntIntTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisablePowIntIntTypeSpec();
                    rejitReason = RejitReason::PowIntIntTypeSpecDisabled;
                }
                break;
            }
            case IR::BailOutOnEarlyExit:
            {
                if (profileInfo->IsOptimizeTryFinallyDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableOptimizeTryFinally();
                    rejitReason = RejitReason::OptimizeTryFinallyDisabled;
                }
                break;
            }
        }

        Assert(!(rejitReason != RejitReason::None && reThunk));
    }

    if(PHASE_FORCE(Js::ReJITPhase, executeFunction) && rejitReason == RejitReason::None)
    {
        rejitReason = RejitReason::Forced;
    }

    if (!reThunk && rejitReason != RejitReason::None)
    {
        // REVIEW: Temporary fix for RS1.  Disable Rejiting if it looks like it is not fixing the problem.
        //         For RS2, turn the rejitCount check into an assert and let's fix all these issues.
        if (profileInfo->GetRejitCount() >= 100 ||
            (profileInfo->GetBailOutOffsetForLastRejit() == actualBailOutOffset && function->IsNewEntryPointAvailable()))
        {
#ifdef REJIT_STATS
            Js::ScriptContext* scriptContext = executeFunction->GetScriptContext();
            if (scriptContext->rejitReasonCountsCap != nullptr)
            {
                scriptContext->rejitReasonCountsCap[static_cast<byte>(rejitReason)]++;
            }
#endif
            reThunk = true;
            rejitReason = RejitReason::None;
        }
        else
        {
            profileInfo->IncRejitCount();
            profileInfo->SetBailOutOffsetForLastRejit(actualBailOutOffset);
        }
    }

    REJIT_KIND_TESTTRACE(bailOutKind, _u("Bailout from function: function: %s, bailOutKindName: (%S), bailOutCount: %d, callCount: %d, reJitReason: %S, reThunk: %s\r\n"),
        function->GetFunctionBody()->GetDisplayName(), ::GetBailOutKindName(bailOutKind), bailOutRecord->bailOutCount, callsCount,
        GetRejitReasonName(rejitReason), reThunk ? trueString : falseString);

    JS_ETW(EventWriteJSCRIPT_BACKEND_BAILOUT(function->GetFunctionBody()->GetLocalFunctionId(),
        function->GetFunctionBody()->GetSourceContextId(), function->GetFunctionBody()->GetDisplayName(), bailOutKind, bailOutRecord->bailOutCount, callsCount,
        GetRejitReasonName(rejitReason), reThunk));

#ifdef REJIT_STATS
    executeFunction->GetScriptContext()->LogBailout(executeFunction, bailOutKind);
    if (bailOutRecord->bailOutCount > 500)
    {
        Js::ScriptContext* scriptContext = executeFunction->GetScriptContext();
        auto bailoutReasonCountsCap = scriptContext->bailoutReasonCountsCap;
        if (bailoutReasonCountsCap != nullptr)
        {
            if (!bailoutReasonCountsCap->ContainsKey(bailOutKind))
            {
                bailoutReasonCountsCap->Item(bailOutKind, 1);
            }
            else
            {
                uint val = bailoutReasonCountsCap->Item(bailOutKind);
                ++val;
                bailoutReasonCountsCap->Item(bailOutKind, val);
            }
        }
    }
#endif

    if (reThunk && executeFunction->DontRethunkAfterBailout())
    {
        // This function is marked for rethunking, but the last ReJIT we've done was for a JIT loop body
        // So the latest rejitted version of this function may not have the right optimization disabled.
        // Rejit just to be safe.
        reThunk = false;
        rejitReason = RejitReason::AfterLoopBodyRejit;
    }
    if (reThunk)
    {
        Js::FunctionEntryPointInfo *const defaultEntryPointInfo = executeFunction->GetDefaultFunctionEntryPointInfo();
        function->UpdateThunkEntryPoint(defaultEntryPointInfo, executeFunction->GetDirectEntryPoint(defaultEntryPointInfo));
    }
    else if (rejitReason != RejitReason::None)
    {
        if (bailOutRecord->IsForLoopTop() && IR::IsTypeCheckBailOutKind(bailOutRecord->bailOutKind))
        {
            // Disable FieldPRE if we're triggering a type check rejit due to a bailout at the loop top.
            // Most likely this was caused by a CheckFixedFld that was hoisted from a branch block where
            // only certain types flowed, to the loop top, where more types (different or non-equivalent)
            // were flowing in.
            profileInfo->DisableFieldPRE();
        }
#ifdef REJIT_STATS
        executeFunction->GetScriptContext()->LogRejit(executeFunction, rejitReason);
#endif
        executeFunction->ClearDontRethunkAfterBailout();

        GenerateFunction(executeFunction->GetScriptContext()->GetNativeCodeGenerator(), executeFunction, function);

        if(executeFunction->GetExecutionMode() != ExecutionMode::FullJit)
        {
            // With expiry, it's possible that the execution mode is currently interpreter or simple JIT. Transition to full JIT
            // after successfully scheduling the rejit work item (in case of OOM).
            executeFunction->TraceExecutionMode("Rejit (before)");
            executeFunction->TransitionToFullJitExecutionMode();
            executeFunction->TraceExecutionMode("Rejit");
        }

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if(PHASE_TRACE(Js::ReJITPhase, executeFunction))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(
                _u("Rejit: function: %s (%s), bailOutCount: %hu"),
                executeFunction->GetDisplayName(),
                executeFunction->GetDebugNumberSet(debugStringBuffer),
                bailOutRecord->bailOutCount);

            Output::Print(_u(" callCount: %u"), callsCount);
            Output::Print(_u(" reason: %S"), GetRejitReasonName(rejitReason));
            if(bailOutKind != IR::BailOutInvalid)
            {
                Output::Print(_u(" (%S)"), ::GetBailOutKindName(bailOutKind));
            }
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }
}